

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall ON_SubDEdgeChain::Write(ON_SubDEdgeChain *this,ON_BinaryArchive *archive)

{
  ON__UINT32 i;
  bool bVar1;
  byte bVar2;
  
  if ((this->m_edge_chain).m_count != 0) {
    SetPersistentEdgeIdsFromRuntimeEdgePtrs(this);
  }
  i = (this->m_persistent_edge_id).m_count;
  bVar1 = ON_BinaryArchive::BeginWrite3dmAnonymousChunk(archive,1);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteUuid(archive,&this->m_persistent_subd_id);
    if (((bVar1) && (bVar1 = ON_BinaryArchive::WriteInt(archive,i), bVar1)) &&
       ((i == 0 ||
        ((bVar1 = ON_BinaryArchive::WriteArray(archive,&this->m_persistent_edge_id), bVar1 &&
         (bVar1 = ON_BinaryArchive::WriteArray(archive,&this->m_persistent_edge_orientation), bVar1)
         ))))) {
      bVar2 = 1;
    }
    else {
      bVar2 = 0;
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    return (bool)(bVar1 & bVar2);
  }
  return false;
}

Assistant:

bool ON_SubDEdgeChain::Write(class ON_BinaryArchive& archive) const
{
  // This write has to work if a read happened but the m_edge_chain[] was never set.
  if (m_edge_chain.UnsignedCount() > 0)
    SetPersistentEdgeIdsFromRuntimeEdgePtrs();
  const unsigned count = m_persistent_edge_id.UnsignedCount();

  if (false == archive.BeginWrite3dmAnonymousChunk(1))
    return false;

  bool rc = false;
  for (;;)
  {
    if (false == archive.WriteUuid(m_persistent_subd_id))
      break;
    if (false == archive.WriteInt(count))
      break;
    if (count > 0)
    {
      if (false == archive.WriteArray(m_persistent_edge_id))
        break;
      if (false == archive.WriteArray(m_persistent_edge_orientation))
        break;
    }

    rc = true;
    break;
  }

  if (false == archive.EndWrite3dmChunk())
    rc = false;

  return rc;
}